

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::Equal(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  char16 cVar1;
  bool bVar2;
  charcount_t cVar3;
  charcount_t cVar4;
  BOOL BVar5;
  int iVar6;
  char16 *pcVar7;
  char16 *__s2;
  
  if (aLeft == aRight) {
    bVar2 = TaggedInt::Is(aLeft);
    if (bVar2) {
      return 1;
    }
    bVar2 = DynamicObject::IsBaseDynamicObject(aLeft);
    if (bVar2) {
      return 1;
    }
  }
  else {
    bVar2 = VarIs<Js::JavascriptString>(aLeft);
    if ((bVar2) && (bVar2 = VarIs<Js::JavascriptString>(aRight), bVar2)) {
      cVar3 = JavascriptString::GetLength((JavascriptString *)aLeft);
      cVar4 = JavascriptString::GetLength((JavascriptString *)aRight);
      if (cVar3 != cVar4) {
        return 0;
      }
      pcVar7 = JavascriptString::UnsafeGetBuffer((JavascriptString *)aLeft);
      if ((pcVar7 != (char16 *)0x0) &&
         (pcVar7 = JavascriptString::UnsafeGetBuffer((JavascriptString *)aRight),
         pcVar7 != (char16 *)0x0)) {
        cVar3 = JavascriptString::GetLength((JavascriptString *)aLeft);
        pcVar7 = JavascriptString::UnsafeGetBuffer((JavascriptString *)aLeft);
        if (cVar3 == 1) {
          cVar1 = *pcVar7;
          pcVar7 = JavascriptString::UnsafeGetBuffer((JavascriptString *)aRight);
          bVar2 = cVar1 == *pcVar7;
        }
        else {
          __s2 = JavascriptString::UnsafeGetBuffer((JavascriptString *)aRight);
          cVar3 = JavascriptString::GetLength((JavascriptString *)aLeft);
          iVar6 = bcmp(pcVar7,__s2,(ulong)cVar3 * 2);
          bVar2 = iVar6 == 0;
        }
        return (uint)bVar2;
      }
    }
  }
  BVar5 = Equal_Full(aLeft,aRight,scriptContext);
  return BVar5;
}

Assistant:

BOOL JavascriptOperators::Equal(Var aLeft, Var aRight, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_Equal);
        JIT_HELPER_SAME_ATTRIBUTES(Op_Equal, Op_Equal_Full);
        if (aLeft == aRight)
        {
            if (TaggedInt::Is(aLeft) || DynamicObject::IsBaseDynamicObject(aLeft))
            {
                return true;
            }
            else
            {
                return Equal_Full(aLeft, aRight, scriptContext);
            }
        }

        if (VarIs<JavascriptString>(aLeft) && VarIs<JavascriptString>(aRight))
        {
            JavascriptString* left = (JavascriptString*)aLeft;
            JavascriptString* right = (JavascriptString*)aRight;

            if (left->GetLength() == right->GetLength())
            {
                if (left->UnsafeGetBuffer() != NULL && right->UnsafeGetBuffer() != NULL)
                {
                    if (left->GetLength() == 1)
                    {
                        return left->UnsafeGetBuffer()[0] == right->UnsafeGetBuffer()[0];
                    }
                    return memcmp(left->UnsafeGetBuffer(), right->UnsafeGetBuffer(), left->GetLength() * sizeof(left->UnsafeGetBuffer()[0])) == 0;
                }
                // fall through to Equal_Full
            }
            else
            {
                return false;
            }
        }

        return Equal_Full(aLeft, aRight, scriptContext);
        JIT_HELPER_END(Op_Equal);
    }